

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.cc
# Opt level: O0

bool __thiscall
tchecker::variable_access_map_t::has_shared_variable
          (variable_access_map_t *this,variable_type_t vtype)

{
  bool bVar1;
  reference __t;
  size_type sVar2;
  __tuple_element_t<1UL,_tuple<unsigned_int,_variable_type_t,_variable_access_t>_> *p_Var3;
  type *access;
  type *type;
  type *id;
  pair<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>,_boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>
  *v2pid;
  const_iterator __end1;
  const_iterator __begin1;
  v2p_map_t *__range1;
  variable_type_t vtype_local;
  variable_access_map_t *this_local;
  
  boost::container::
  flat_map<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>,_boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>,_std::less<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>_>,_void>
  ::begin((flat_map<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>,_boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>,_std::less<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>_>,_void>
           *)&__end1);
  boost::container::
  flat_map<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>,_boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>,_std::less<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>_>,_void>
  ::end((flat_map<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>,_boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>,_std::less<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>_>,_void>
         *)&v2pid);
  do {
    bVar1 = boost::container::operator!=
                      (&__end1,(vec_iterator<std::pair<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>,_boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>_*,_true>
                                *)&v2pid);
    if (!bVar1) {
      return false;
    }
    __t = boost::container::
          vec_iterator<std::pair<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>,_boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>_*,_true>
          ::operator*(&__end1);
    sVar2 = boost::container::dtl::
            flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
            ::size(&(__t->second).
                    super_flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
                  );
    if (1 < sVar2) {
      std::get<0ul,unsigned_int,tchecker::variable_type_t,tchecker::variable_access_t>(&__t->first);
      p_Var3 = std::get<1ul,unsigned_int,tchecker::variable_type_t,tchecker::variable_access_t>
                         (&__t->first);
      std::get<2ul,unsigned_int,tchecker::variable_type_t,tchecker::variable_access_t>(&__t->first);
      if (*p_Var3 == vtype) {
        return true;
      }
    }
    boost::container::
    vec_iterator<std::pair<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>,_boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>_*,_true>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool variable_access_map_t::has_shared_variable(enum tchecker::variable_type_t vtype) const
{
  for (auto && v2pid : _v2p_map) {
    if (v2pid.second.size() <= 1)
      continue;
    auto && [id, type, access] = v2pid.first;
    if (type == vtype)
      return true;
  }
  return false;
}